

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O1

int wally_confidential_addr_from_addr
              (char *address,uint32_t prefix,uchar *pub_key,size_t pub_key_len,char **output)

{
  int iVar1;
  size_t written;
  uchar buf [59];
  size_t local_70;
  uchar local_68;
  uchar local_67;
  undefined1 local_66 [32];
  uchar local_46 [30];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar1 = -2;
  if ((address != (char *)0x0) &&
     ((pub_key_len == 0x21 && output != (char **)0x0) && (pub_key != (uchar *)0x0 && prefix < 0x100)
     )) {
    iVar1 = wally_base58_to_bytes(address,1,local_46,0x19,&local_70);
    if ((iVar1 == 0) && (iVar1 = -2, local_70 == 0x15)) {
      local_67 = local_46[0];
      local_68 = (uchar)prefix;
      memcpy(local_66,pub_key,pub_key_len);
      iVar1 = wally_base58_from_bytes(&local_68,0x37,1,output);
    }
    wally_clear(&local_68,0x3b);
  }
  return iVar1;
}

Assistant:

int wally_confidential_addr_from_addr(
    const char *address,
    uint32_t prefix,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    unsigned char buf[2 + EC_PUBLIC_KEY_LEN + HASH160_LEN + BASE58_CHECKSUM_LEN];
    unsigned char *addr_bytes_p = &buf[EC_PUBLIC_KEY_LEN + 1];
    size_t written;
    int ret;

    if (output)
        *output = NULL;

    if (!address || (prefix & 0xffffff00) || !pub_key || pub_key_len != EC_PUBLIC_KEY_LEN || !output)
        return WALLY_EINVAL;

    /* Decode the passed address */
    ret = wally_base58_to_bytes(address, BASE58_FLAG_CHECKSUM,
                                addr_bytes_p, 1 + HASH160_LEN + BASE58_CHECKSUM_LEN, &written);
    if (ret == WALLY_OK) {
        if (written != HASH160_LEN + 1)
            ret = WALLY_EINVAL;
        else {
            /* Copy the prefix/version/pubkey and encode the address to return */
            buf[0] = prefix & 0xff;
            buf[1] = addr_bytes_p[0];
            memcpy(buf + 2, pub_key, pub_key_len);
            ret = wally_base58_from_bytes(buf, sizeof(buf) - BASE58_CHECKSUM_LEN,
                                          BASE58_FLAG_CHECKSUM, output);
        }
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}